

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsTextItemPrivate::_q_update(QGraphicsTextItemPrivate *this,QRectF rect)

{
  char cVar1;
  QPointF QVar2;
  
  if ((rect.w <= 0.0) || (rect.h <= 0.0)) {
    rect.xp = (this->boundingRect).xp;
    rect.yp = (this->boundingRect).yp;
    rect.w = (this->boundingRect).w;
    rect.h = (this->boundingRect).h;
  }
  else {
    QVar2 = controlOffset(this);
    rect.xp = rect.xp - QVar2.xp;
    rect.yp = rect.yp - QVar2.yp;
  }
  cVar1 = QRectF::intersects((QRectF *)&rect);
  if (cVar1 != '\0') {
    QGraphicsItem::update(&(this->qq->super_QGraphicsObject).super_QGraphicsItem,&rect);
  }
  return;
}

Assistant:

void QGraphicsTextItemPrivate::_q_update(QRectF rect)
{
    if (rect.isValid()) {
        rect.translate(-controlOffset());
    } else {
        rect = boundingRect;
    }
    if (rect.intersects(boundingRect))
        qq->update(rect);
}